

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
license::unbase64(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                 string *base64_data)

{
  pointer *ppuVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  pointer pcVar5;
  iterator iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  uint uVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  string tmp_str;
  byte local_61;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  ulong local_58;
  char local_50 [16];
  ulong local_40;
  ulong local_38;
  
  local_60._M_current = local_50;
  pcVar5 = (base64_data->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar5,pcVar5 + base64_data->_M_string_length);
  local_61 = 10;
  _Var9 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_60,local_60._M_current + local_58,(_Iter_equals_val<const_char>)&local_61
                    );
  _Var7._M_current = local_60._M_current;
  uVar10 = (long)_Var9._M_current - (long)local_60._M_current;
  *_Var9._M_current = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = uVar10;
  if (uVar10 < 2) {
    puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
    goto LAB_0019b0c0;
  }
  uVar12 = (ulong)((local_60._M_current[uVar10 - 1] == '=') + 1);
  if (local_60._M_current[uVar10 - 2] != '=') {
    uVar12 = (ulong)(local_60._M_current[uVar10 - 1] == '=');
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(uVar10 * 3 >> 2) - uVar12);
  local_38 = (uVar10 - uVar12) - 4;
  uVar10 = 0;
  uVar8 = 2;
  local_40 = uVar12;
  do {
    uVar11 = uVar8;
    bVar2 = unb64[(byte)_Var7._M_current[uVar11 - 1]];
    bVar3 = unb64[(byte)_Var7._M_current[uVar11]];
    bVar4 = unb64[(byte)_Var7._M_current[uVar11 + 1]];
    local_61 = bVar2 >> 4 | unb64[(byte)_Var7._M_current[uVar10]] << 2;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar6,&local_61);
    }
    else {
      *iVar6._M_current = local_61;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_61 = bVar3 >> 2 | bVar2 << 4;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar6,&local_61);
    }
    else {
      *iVar6._M_current = local_61;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_61 = bVar4 | bVar3 << 6;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar6,&local_61);
    }
    else {
      *iVar6._M_current = local_61;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    uVar10 = (ulong)(uVar11 + 2);
    uVar8 = uVar11 + 4;
  } while (uVar10 <= local_38);
  if (local_40 == 2) {
    local_61 = (byte)unb64[(byte)_Var7._M_current[uVar11 + 3]] >> 4 |
               unb64[(byte)_Var7._M_current[uVar10]] << 2;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar6,&local_61);
      goto LAB_0019b0c0;
    }
    *iVar6._M_current = local_61;
  }
  else {
    if ((int)local_40 != 1) goto LAB_0019b0c0;
    bVar2 = unb64[(byte)_Var7._M_current[uVar11 + 3]];
    bVar3 = unb64[(byte)_Var7._M_current[uVar11 + 4]];
    local_61 = bVar2 >> 4 | unb64[(byte)_Var7._M_current[uVar10]] << 2;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar6,&local_61);
    }
    else {
      *iVar6._M_current = local_61;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_61 = bVar3 >> 2 | bVar2 << 4;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar6,&local_61);
      goto LAB_0019b0c0;
    }
    *iVar6._M_current = local_61;
  }
  ppuVar1 = &(__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
LAB_0019b0c0:
  if (local_60._M_current != local_50) {
    operator_delete(local_60._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> unbase64(const std::string& base64_data) {
	string tmp_str(base64_data);
	tmp_str.erase(std::remove(tmp_str.begin(), tmp_str.end(), '\n'), tmp_str.end());
	const unsigned char* safeAsciiPtr = (const unsigned char*)tmp_str.c_str();
	std::vector<uint8_t> bin;
	// int cb = 0;
	unsigned int charNo;
	int pad = 0;
	size_t len = tmp_str.size();

	if (len < 2) {  // 2 accesses below would be OOB.
		// catch empty string, return NULL as result.
		puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
		return bin;
	}
	if (safeAsciiPtr[len - 1] == '=') ++pad;
	if (safeAsciiPtr[len - 2] == '=') ++pad;

	size_t flen = 3 * len / 4 - pad;
	bin.reserve(flen);

	for (charNo = 0; charNo <= len - 4 - pad; charNo += 4) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		int D = unb64[safeAsciiPtr[charNo + 3]];

		bin.push_back((A << 2) | (B >> 4));
		bin.push_back((B << 4) | (C >> 2));
		bin.push_back((C << 6) | (D));
	}

	if (pad == 1) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		bin.push_back((A << 2) | (B >> 4));
		bin.push_back((B << 4) | (C >> 2));
	} else if (pad == 2) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		bin.push_back((A << 2) | (B >> 4));
	}

	return bin;
}